

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> * __thiscall
cfd::core::ConfidentialTransaction::UnblindTxIn
          (vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
           *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t tx_in_index,
          Privkey *blinding_key,Privkey *token_blinding_key)

{
  ConfidentialValue *object;
  ByteData issuance_amount_rangeproof;
  ByteData inflation_keys_rangeproof;
  Privkey *pPVar1;
  uint8_t uVar2;
  bool bVar3;
  uint32_t vout;
  size_t sVar4;
  CfdException *this_00;
  pointer in_stack_fffffffffffffac8;
  Privkey *local_530;
  undefined4 uStack_528;
  uint32_t tx_in_index_local;
  Privkey *local_520;
  ByteData token_rangeproof;
  ByteData amount_rangeproof;
  ConfidentialValue local_4e8;
  UnblindParameter local_4c0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_430;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_418;
  Script local_400;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3c8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3b0;
  UnblindParameter asset_unblind;
  UnblindParameter token_unblind;
  ConfidentialValue local_278;
  ConfidentialValue local_250;
  ConfidentialValue local_228;
  ConfidentialTxIn tx_in;
  IssuanceParameter issue;
  
  tx_in_index_local = tx_in_index;
  local_520 = token_blinding_key;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0xb0d,"UnblindTxIn");
  ConfidentialTxIn::ConfidentialTxIn
            (&tx_in,(this->vin_).
                    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                    ._M_impl.super__Vector_impl_data._M_start + tx_in_index);
  object = &tx_in.issuance_amount_;
  ConfidentialValue::ConfidentialValue((ConfidentialValue *)&asset_unblind,object);
  if (asset_unblind.asset.version_ < 2) {
    ConfidentialValue::ConfidentialValue(&local_228,&tx_in.inflation_keys_);
    bVar3 = true;
    if (1 < local_228.version_) goto LAB_003b24ee;
  }
  else {
LAB_003b24ee:
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&token_unblind,
               &tx_in.issuance_amount_rangeproof_.data_);
    sVar4 = ByteData::GetDataSize((ByteData *)&token_unblind);
    if (sVar4 == 0) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_4c0,
                 &tx_in.inflation_keys_rangeproof_.data_);
      sVar4 = ByteData::GetDataSize((ByteData *)&local_4c0);
      bVar3 = sVar4 == 0;
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_4c0);
    }
    else {
      bVar3 = false;
    }
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&token_unblind);
    if (1 < asset_unblind.asset.version_) goto LAB_003b2567;
  }
  ConfidentialValue::~ConfidentialValue(&local_228);
LAB_003b2567:
  ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&asset_unblind);
  if (!bVar3) {
    AbstractTxIn::GetTxid((Txid *)&asset_unblind,&tx_in.super_AbstractTxIn);
    vout = AbstractTxIn::GetVout(&tx_in.super_AbstractTxIn);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&token_unblind,
               &tx_in.asset_entropy_.data_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_4c0,
               &tx_in.blinding_nonce_.data_);
    CalculateIssuanceValue
              (&issue,(Txid *)&asset_unblind,vout,true,(ByteData256 *)&token_unblind,
               (ByteData256 *)&local_4c0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_4c0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&token_unblind);
    Txid::~Txid((Txid *)&asset_unblind);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&amount_rangeproof.data_,&tx_in.issuance_amount_rangeproof_.data_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&token_rangeproof.data_,&tx_in.inflation_keys_rangeproof_.data_);
    UnblindParameter::UnblindParameter(&asset_unblind);
    UnblindParameter::UnblindParameter(&token_unblind);
    ConfidentialValue::ConfidentialValue((ConfidentialValue *)&local_4c0,object);
    uVar2 = local_4c0.asset.version_;
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&local_4c0);
    if (1 < uVar2) {
      ConfidentialValue::ConfidentialValue(&local_4e8,object);
      Script::Script(&local_400);
      CalculateUnblindIssueData
                (&local_4c0,blinding_key,&amount_rangeproof,&local_4e8,&local_400,&issue.asset);
      UnblindParameter::operator=(&asset_unblind,&local_4c0);
      UnblindParameter::~UnblindParameter(&local_4c0);
      Script::~Script(&local_400);
      ConfidentialValue::~ConfidentialValue(&local_4e8);
      ByteData::ByteData((ByteData *)&local_4c0);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&amount_rangeproof.data_,&local_4c0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_4c0);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_4c0,
               &tx_in.inflation_keys_rangeproof_.data_);
    sVar4 = ByteData::GetDataSize((ByteData *)&local_4c0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_4c0);
    local_530 = blinding_key;
    if (sVar4 != 0) {
      ConfidentialValue::ConfidentialValue((ConfidentialValue *)&local_4c0,&tx_in.inflation_keys_);
      ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&local_4c0);
      pPVar1 = local_520;
      if (1 < local_4c0.asset.version_) {
        bVar3 = Privkey::IsValid(local_520);
        if (bVar3) {
          local_530 = pPVar1;
        }
        ConfidentialValue::ConfidentialValue(&local_4e8,&tx_in.inflation_keys_);
        Script::Script(&local_400);
        CalculateUnblindIssueData
                  (&local_4c0,local_530,&token_rangeproof,&local_4e8,&local_400,&issue.token);
        UnblindParameter::operator=(&token_unblind,&local_4c0);
        UnblindParameter::~UnblindParameter(&local_4c0);
        Script::~Script(&local_400);
        ConfidentialValue::~ConfidentialValue(&local_4e8);
        ByteData::ByteData((ByteData *)&local_4c0);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  (&token_rangeproof.data_,&local_4c0);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_4c0);
      }
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_418,
               &tx_in.blinding_nonce_.data_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_430,
               &tx_in.asset_entropy_.data_);
    ConfidentialValue::ConfidentialValue(&local_250,&asset_unblind.value);
    ConfidentialValue::ConfidentialValue(&local_278,&token_unblind.value);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3b0,
               &amount_rangeproof.data_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3c8,
               &token_rangeproof.data_);
    issuance_amount_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_3c8;
    issuance_amount_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_3b0;
    issuance_amount_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffac8;
    inflation_keys_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = uStack_528;
    inflation_keys_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_530;
    inflation_keys_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = tx_in_index_local;
    inflation_keys_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_520;
    SetIssuance(this,tx_in_index,(ByteData256 *)&local_418,(ByteData256 *)&local_430,&local_250,
                &local_278,issuance_amount_rangeproof,inflation_keys_rangeproof);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3c8);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3b0);
    ConfidentialValue::~ConfidentialValue(&local_278);
    ConfidentialValue::~ConfidentialValue(&local_250);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_430);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_418);
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
    push_back(__return_storage_ptr__,&asset_unblind);
    ::std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
    push_back(__return_storage_ptr__,&token_unblind);
    UnblindParameter::~UnblindParameter(&token_unblind);
    UnblindParameter::~UnblindParameter(&asset_unblind);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&token_rangeproof);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&amount_rangeproof);
    IssuanceParameter::~IssuanceParameter(&issue);
    ConfidentialTxIn::~ConfidentialTxIn(&tx_in);
    return __return_storage_ptr__;
  }
  asset_unblind.asset._vptr_ConfidentialAssetId = (_func_int **)0x4b5451;
  asset_unblind.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb15;
  asset_unblind.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "UnblindTxIn";
  logger::warn<unsigned_int&>
            ((CfdSourceLocation *)&asset_unblind,
             "Failed to unblind TxIn. Target TxIn already unblinded.: tx_in_index=[{}]",
             &tx_in_index_local);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&asset_unblind,"Failed to unblind TxIn. Target TxIn already unblinded.",
             (allocator *)&token_unblind);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&asset_unblind);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<UnblindParameter> ConfidentialTransaction::UnblindTxIn(
    uint32_t tx_in_index, const Privkey &blinding_key,
    const Privkey token_blinding_key) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  ConfidentialTxIn tx_in(vin_[tx_in_index]);
  if (((!tx_in.GetIssuanceAmount().HasBlinding()) &&
       (!tx_in.GetInflationKeys().HasBlinding())) ||
      ((tx_in.GetIssuanceAmountRangeproof().GetDataSize() == 0) &&
       (tx_in.GetInflationKeysRangeproof().GetDataSize() == 0))) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to unblind TxIn. Target TxIn already unblinded.: "
        "tx_in_index=[{}]",
        tx_in_index);
    throw CfdException(
        kCfdIllegalStateError,
        "Failed to unblind TxIn. Target TxIn already unblinded.");
  }

  IssuanceParameter issue = CalculateIssuanceValue(
      tx_in.GetTxid(), tx_in.GetVout(), true, tx_in.GetAssetEntropy(),
      tx_in.GetBlindingNonce());

  ByteData amount_rangeproof = tx_in.GetIssuanceAmountRangeproof();
  ByteData token_rangeproof = tx_in.GetInflationKeysRangeproof();

  UnblindParameter asset_unblind;
  UnblindParameter token_unblind;

  if (tx_in.GetIssuanceAmount().HasBlinding()) {
    asset_unblind = CalculateUnblindIssueData(
        blinding_key, amount_rangeproof, tx_in.GetIssuanceAmount(), Script(),
        issue.asset);
    amount_rangeproof = ByteData();
  }

  if (tx_in.GetInflationKeysRangeproof().GetDataSize() != 0) {
    if (tx_in.GetInflationKeys().HasBlinding()) {
      token_unblind = CalculateUnblindIssueData(
          (token_blinding_key.IsValid()) ? token_blinding_key : blinding_key,
          token_rangeproof, tx_in.GetInflationKeys(), Script(), issue.token);
      token_rangeproof = ByteData();
    }
  }

  // clear and set unblind value to txin
  SetIssuance(
      tx_in_index, tx_in.GetBlindingNonce(), tx_in.GetAssetEntropy(),
      asset_unblind.value, token_unblind.value, amount_rangeproof,
      token_rangeproof);
  std::vector<UnblindParameter> result;
  result.push_back(asset_unblind);
  result.push_back(token_unblind);

  return result;
}